

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

float gimage::getMutualInformationU8
                (ImageFloat *mi,ImageU8 *image1,ImageU8 *image2,ImageFloat *disp,int channel)

{
  store_t_conflict1 sVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  long *plVar8;
  store_t_conflict1 *psVar9;
  long lVar10;
  GaussKernel *this;
  float *pfVar11;
  double dVar12;
  Image<float,_gimage::PixelTraits<float>_> *in_RCX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  int in_R8D;
  float fVar13;
  float fVar14;
  long i_11;
  float v_2;
  long k_7;
  long i_10;
  double entropy2;
  long i_9;
  long i_8;
  float sum_1;
  long k_6;
  long k_5;
  float v_1;
  long i_7;
  long i_6;
  double entropy1;
  long i_5;
  ImageFloat Pg1;
  GaussKernel gk;
  long k_4;
  float sum;
  long i_4;
  ImageFloat P1;
  long i_3;
  long k_3;
  float *pg;
  double entropy;
  ImageFloat Pg;
  long i_2;
  long k_2;
  long i_1;
  long k_1;
  int d;
  long height_1;
  long width_1;
  long ii;
  float v;
  long i;
  long k;
  long n;
  long height;
  long width;
  float scale;
  ImageFloat P;
  store_t_conflict1 in_stack_fffffffffffffa9c;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffffaa0;
  long in_stack_fffffffffffffaa8;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffffab0;
  double in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffad0;
  float in_stack_fffffffffffffad4;
  long in_stack_fffffffffffffae8;
  store_t_conflict1 *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  float in_stack_fffffffffffffafc;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffffb00;
  Image<float,_gimage::PixelTraits<float>_> *image;
  GaussKernel *in_stack_fffffffffffffb08;
  float in_stack_fffffffffffffba4;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffffba8;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffffbb0;
  long local_298;
  long local_288;
  long local_280;
  double local_278;
  Image<float,_gimage::PixelTraits<float>_> *local_270;
  long local_268;
  float local_25c;
  long local_258;
  long local_250;
  long local_240;
  long local_238;
  double local_230;
  long local_228;
  Image<float,_gimage::PixelTraits<float>_> local_220;
  long local_1d8;
  store_t_conflict1 local_1cc;
  long local_1c8;
  Image<float,_gimage::PixelTraits<float>_> local_1c0;
  long local_188;
  long local_180;
  float *local_178;
  double local_170;
  Image<float,_gimage::PixelTraits<float>_> local_168;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  int local_10c;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  float local_cc;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  store_t_conflict1 local_70;
  Image<float,_gimage::PixelTraits<float>_> local_60;
  int local_24;
  Image<float,_gimage::PixelTraits<float>_> *local_20;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_18;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  Image<float,_gimage::PixelTraits<float>_> *local_8;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Image<float,_gimage::PixelTraits<float>_>::Image
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,(long)in_stack_fffffffffffffaa0,
             (int)in_stack_fffffffffffffa9c);
  Image<float,_gimage::PixelTraits<float>_>::operator=
            (in_stack_fffffffffffffab0,(store_t_conflict1)((ulong)in_stack_fffffffffffffaa8 >> 0x20)
            );
  lVar7 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_20);
  if ((lVar7 < 1) ||
     (lVar7 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_20), lVar7 < 1)) {
    local_e8 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10);
    local_f0 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_18);
    plVar8 = std::min<long>(&local_e8,&local_f0);
    local_e0 = *plVar8;
    local_100 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10);
    local_108 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_18);
    plVar8 = std::min<long>(&local_100,&local_108);
    local_f8 = *plVar8;
    for (local_10c = 0; iVar2 = local_10c,
        iVar6 = Image<float,_gimage::PixelTraits<float>_>::getDepth(&local_60), iVar2 < iVar6;
        local_10c = local_10c + 1) {
      for (local_118 = 0; local_118 < local_f8; local_118 = local_118 + 1) {
        for (local_120 = 0; local_120 < local_e0; local_120 = local_120 + 1) {
          bVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator()
                            (local_10,(int)local_120,(int)local_118,local_24);
          bVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator()
                            (local_18,(int)local_120,(int)local_118,local_24);
          psVar9 = Image<float,_gimage::PixelTraits<float>_>::operator()
                             (&local_60,(uint)bVar4,(uint)bVar5,0);
          *psVar9 = *psVar9 + 1.0;
        }
      }
    }
    local_70 = 1.0 / (float)(local_e0 * local_f8);
    operator*=((Image<float,_gimage::PixelTraits<float>_> *)
               CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
               in_stack_fffffffffffffac8);
  }
  else {
    local_80 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10);
    local_88 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_18);
    plVar8 = std::min<long>(&local_80,&local_88);
    local_90 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_20);
    plVar8 = std::min<long>(plVar8,&local_90);
    local_78 = *plVar8;
    local_a0 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10);
    local_a8 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_18);
    plVar8 = std::min<long>(&local_a0,&local_a8);
    local_b0 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_20);
    plVar8 = std::min<long>(plVar8,&local_b0);
    local_98 = *plVar8;
    local_b8 = 0;
    for (local_c0 = 0; local_c0 < local_98; local_c0 = local_c0 + 1) {
      for (local_c8 = 0; local_c8 < local_78; local_c8 = local_c8 + 1) {
        local_cc = Image<float,_gimage::PixelTraits<float>_>::operator()
                             (local_20,(int)local_c8,(int)local_c0,0);
        bVar3 = Image<float,_gimage::PixelTraits<float>_>::isValidS
                          (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
        if ((bVar3) && (local_cc < (float)local_c8)) {
          local_d8 = (long)((float)local_c8 - local_cc);
          local_cc = ((float)local_c8 - local_cc) - (float)local_d8;
          fVar13 = 1.0 - local_cc;
          bVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator()
                            (local_18,(int)local_c8,(int)local_c0,local_24);
          fVar14 = local_cc;
          bVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator()
                            (local_18,(int)local_c8,(int)local_c0,local_24);
          local_cc = (fVar13 * (float)bVar4 + fVar14 * (float)bVar5) * 0.5;
          bVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator()
                            (local_10,(int)local_c8,(int)local_c0,local_24);
          psVar9 = Image<float,_gimage::PixelTraits<float>_>::operator()
                             (&local_60,(uint)bVar4,(int)(local_cc + 0.5),0);
          *psVar9 = *psVar9 + 1.0;
          local_b8 = local_b8 + 1;
        }
      }
    }
    local_70 = 1.0 / (float)local_b8;
    operator*=((Image<float,_gimage::PixelTraits<float>_> *)
               CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
               in_stack_fffffffffffffac8);
  }
  for (local_128 = 0; lVar7 = local_128,
      lVar10 = Image<float,_gimage::PixelTraits<float>_>::getHeight(&local_60), lVar7 < lVar10;
      local_128 = local_128 + 1) {
    for (local_130 = 0; lVar7 = local_130,
        lVar10 = Image<float,_gimage::PixelTraits<float>_>::getWidth(&local_60), lVar7 < lVar10;
        local_130 = local_130 + 1) {
      psVar9 = Image<float,_gimage::PixelTraits<float>_>::operator()
                         (&local_60,(int)local_130,(int)local_128,0);
      sVar1 = local_70;
      if ((*psVar9 == 0.0) && (!NAN(*psVar9))) {
        psVar9 = Image<float,_gimage::PixelTraits<float>_>::operator()
                           (&local_60,(int)local_130,(int)local_128,0);
        *psVar9 = sVar1;
      }
    }
  }
  Image<float,_gimage::PixelTraits<float>_>::Image
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,(long)in_stack_fffffffffffffaa0,
             (int)in_stack_fffffffffffffa9c);
  gauss<float>(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba4);
  local_170 = 0.0;
  local_178 = Image<float,_gimage::PixelTraits<float>_>::getPtr(&local_168,0,0,0);
  for (local_180 = 0; lVar7 = local_180,
      lVar10 = Image<float,_gimage::PixelTraits<float>_>::getHeight(&local_168), lVar7 < lVar10;
      local_180 = local_180 + 1) {
    for (local_188 = 0; lVar7 = local_188,
        lVar10 = Image<float,_gimage::PixelTraits<float>_>::getWidth(&local_168), lVar7 < lVar10;
        local_188 = local_188 + 1) {
      fVar14 = anon_unknown_11::negLog((float *)in_stack_fffffffffffffaa0);
      local_170 = (double)fVar14 + local_170;
      local_178 = local_178 + 1;
    }
  }
  gauss<float>(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba4);
  Image<float,_gimage::PixelTraits<float>_>::getWidth(&local_60);
  Image<float,_gimage::PixelTraits<float>_>::Image
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,(long)in_stack_fffffffffffffaa0,
             (int)in_stack_fffffffffffffa9c);
  for (local_1c8 = 0; lVar7 = local_1c8,
      lVar10 = Image<float,_gimage::PixelTraits<float>_>::getWidth(&local_60), lVar7 < lVar10;
      local_1c8 = local_1c8 + 1) {
    local_1cc = 0.0;
    local_1d8 = 0;
    while( true ) {
      lVar7 = local_1d8;
      lVar10 = Image<float,_gimage::PixelTraits<float>_>::getHeight(&local_60);
      sVar1 = local_1cc;
      if (lVar10 <= lVar7) break;
      psVar9 = Image<float,_gimage::PixelTraits<float>_>::operator()
                         (&local_60,(int)local_1c8,(int)local_1d8,0);
      local_1cc = *psVar9 + local_1cc;
      local_1d8 = local_1d8 + 1;
    }
    psVar9 = Image<float,_gimage::PixelTraits<float>_>::operator()(&local_1c0,(int)local_1c8,0,0);
    *psVar9 = sVar1;
  }
  GaussKernel::GaussKernel((GaussKernel *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
  Image<float,_gimage::PixelTraits<float>_>::getWidth(&local_60);
  Image<float,_gimage::PixelTraits<float>_>::Image
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,(long)in_stack_fffffffffffffaa0,
             (int)in_stack_fffffffffffffa9c);
  for (local_228 = 0; lVar7 = Image<float,_gimage::PixelTraits<float>_>::getWidth(&local_1c0),
      local_228 < lVar7; local_228 = local_228 + 1) {
    fVar14 = GaussKernel::convolveHorizontal<float>
                       (in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
                        CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                        (long)in_stack_fffffffffffffaf0,
                        (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
    psVar9 = Image<float,_gimage::PixelTraits<float>_>::operator()(&local_220,(int)local_228,0,0);
    *psVar9 = fVar14;
  }
  local_230 = 0.0;
  local_178 = Image<float,_gimage::PixelTraits<float>_>::getPtr(&local_220,0,0,0);
  local_238 = 0;
  while (lVar7 = local_238, lVar10 = Image<float,_gimage::PixelTraits<float>_>::getWidth(&local_220)
        , lVar7 < lVar10) {
    fVar14 = anon_unknown_11::negLog((float *)in_stack_fffffffffffffaa0);
    local_230 = (double)fVar14 + local_230;
    local_178 = local_178 + 1;
    local_238 = local_238 + 1;
  }
  for (local_240 = 0; lVar7 = Image<float,_gimage::PixelTraits<float>_>::getWidth(&local_220),
      local_240 < lVar7; local_240 = local_240 + 1) {
    fVar14 = GaussKernel::convolveHorizontal<float>
                       (in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
                        CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                        (long)in_stack_fffffffffffffaf0,
                        (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
    for (local_250 = 0; lVar7 = Image<float,_gimage::PixelTraits<float>_>::getHeight(&local_60),
        local_250 < lVar7; local_250 = local_250 + 1) {
      psVar9 = Image<float,_gimage::PixelTraits<float>_>::operator()
                         (local_8,(int)local_240,(int)local_250,0);
      fVar13 = *psVar9;
      psVar9 = Image<float,_gimage::PixelTraits<float>_>::operator()
                         (local_8,(int)local_240,(int)local_250,0);
      *psVar9 = fVar14 - fVar13;
    }
  }
  Image<float,_gimage::PixelTraits<float>_>::getHeight(&local_60);
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (in_stack_fffffffffffffb00,CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8)
             ,(long)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  for (local_258 = 0; lVar7 = Image<float,_gimage::PixelTraits<float>_>::getHeight(&local_60),
      local_258 < lVar7; local_258 = local_258 + 1) {
    local_25c = 0.0;
    local_268 = 0;
    while( true ) {
      lVar7 = Image<float,_gimage::PixelTraits<float>_>::getWidth(&local_60);
      if (lVar7 <= local_268) break;
      psVar9 = Image<float,_gimage::PixelTraits<float>_>::operator()
                         (&local_60,(int)local_268,(int)local_258,0);
      local_25c = *psVar9 + local_25c;
      local_268 = local_268 + 1;
    }
    psVar9 = Image<float,_gimage::PixelTraits<float>_>::operator()(&local_1c0,(int)local_258,0,0);
    *psVar9 = local_25c;
  }
  Image<float,_gimage::PixelTraits<float>_>::getHeight(&local_60);
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (in_stack_fffffffffffffb00,CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8)
             ,(long)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  local_270 = (Image<float,_gimage::PixelTraits<float>_> *)0x0;
  while (image = local_270,
        this = (GaussKernel *)Image<float,_gimage::PixelTraits<float>_>::getWidth(&local_220),
        (long)image < (long)this) {
    in_stack_fffffffffffffafc =
         GaussKernel::convolveHorizontal<float>
                   (this,image,CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                    (long)in_stack_fffffffffffffaf0,(int)((ulong)in_stack_fffffffffffffae8 >> 0x20))
    ;
    in_stack_fffffffffffffaf0 =
         Image<float,_gimage::PixelTraits<float>_>::operator()(&local_220,(int)local_270,0,0);
    *in_stack_fffffffffffffaf0 = in_stack_fffffffffffffafc;
    local_270 = (Image<float,_gimage::PixelTraits<float>_> *)((long)&local_270->depth + 1);
  }
  local_278 = 0.0;
  pfVar11 = Image<float,_gimage::PixelTraits<float>_>::getPtr(&local_220,0,0,0);
  local_178 = pfVar11;
  for (local_280 = 0; lVar7 = Image<float,_gimage::PixelTraits<float>_>::getWidth(&local_220),
      local_280 < lVar7; local_280 = local_280 + 1) {
    in_stack_fffffffffffffad4 = anon_unknown_11::negLog((float *)in_stack_fffffffffffffaa0);
    local_278 = (double)in_stack_fffffffffffffad4 + local_278;
    local_178 = local_178 + 1;
  }
  for (local_288 = 0;
      dVar12 = (double)Image<float,_gimage::PixelTraits<float>_>::getWidth(&local_220),
      local_288 < (long)dVar12; local_288 = local_288 + 1) {
    fVar14 = GaussKernel::convolveHorizontal<float>
                       (this,image,CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                        (long)in_stack_fffffffffffffaf0,(int)((ulong)pfVar11 >> 0x20));
    local_298 = 0;
    while (lVar7 = local_298,
          in_stack_fffffffffffffab0 =
               (Image<float,_gimage::PixelTraits<float>_> *)
               Image<float,_gimage::PixelTraits<float>_>::getWidth(&local_60),
          lVar7 < (long)in_stack_fffffffffffffab0) {
      fVar13 = fVar14;
      in_stack_fffffffffffffaa0 =
           (Image<float,_gimage::PixelTraits<float>_> *)
           Image<float,_gimage::PixelTraits<float>_>::operator()
                     (local_8,(int)local_298,(int)local_288,0);
      in_stack_fffffffffffffaa0->depth = (int)(fVar13 + (float)in_stack_fffffffffffffaa0->depth);
      local_298 = local_298 + 1;
    }
  }
  operator*=((Image<float,_gimage::PixelTraits<float>_> *)
             CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),dVar12);
  dVar12 = (local_230 + local_278) - local_170;
  Image<float,_gimage::PixelTraits<float>_>::~Image(in_stack_fffffffffffffab0);
  GaussKernel::~GaussKernel((GaussKernel *)in_stack_fffffffffffffaa0);
  Image<float,_gimage::PixelTraits<float>_>::~Image(in_stack_fffffffffffffab0);
  Image<float,_gimage::PixelTraits<float>_>::~Image(in_stack_fffffffffffffab0);
  Image<float,_gimage::PixelTraits<float>_>::~Image(in_stack_fffffffffffffab0);
  return (float)dVar12;
}

Assistant:

float getMutualInformationU8(ImageFloat &mi, const ImageU8 &image1, const ImageU8 &image2,
  const ImageFloat &disp, int channel)
{
  ImageFloat P(256, 256, 1);
  P=0;

  // For computation of mutual information, see Hirschmueller (2008, TPAMI) or
  // Hirschmueller (2005, CVPR).

  // compute joint probabilities P_I1,I2

  float scale; // 1/number_of_correspondences

  if (disp.getWidth() > 0 && disp.getHeight() > 0)
  {
    long width=std::min(std::min(image1.getWidth(), image2.getWidth()), disp.getWidth());
    long height=std::min(std::min(image1.getHeight(), image2.getHeight()), disp.getHeight());
    long n=0;

    for (long k=0; k<height; k++)
    {
      for (long i=0; i<width; i++)
      {
        float v=disp(i, k, 0);

        if (disp.isValidS(v) && v < i)
        {
          v=i-v; // pixel in right image
          long ii=static_cast<long>(v); // full pixel
          v-=ii; // fraction

          // get intensity frpm right image by linear interpolation
          v=0.5f*((1-v)*image2(i, k, channel)+v*image2(i, k, channel));

          // increment corresponding cell in joint histogram
          P(image1(i, k, channel), static_cast<int>(v+0.5f))++;

          n++;
        }
      }
    }

    scale=1.0f/n;
    P*=scale;
  }
  else
  {
    long width=std::min(image1.getWidth(), image2.getWidth());
    long height=std::min(image1.getHeight(), image2.getHeight());

    for (int d=0; d<P.getDepth(); d++)
    {
      for (long k=0; k<height; k++)
      {
        for (long i=0; i<width; i++)
        {
          // increment corresponding cell in joint histogram
          P(image1(i, k, channel), image2(i, k, channel))++;
        }
      }
    }

    scale=1.0f/(width*height);
    P*=scale;
  }

  // replace all cells with 0 by the smallest value to avoid computing log(0)

  for (long k=0; k<P.getHeight(); k++)
  {
    for (long i=0; i<P.getWidth(); i++)
    {
      if (P(i, k) == 0) P(i, k)=scale;
    }
  }

  // compute joint entropy h_I1,I2 = -Gauss_convolution(log(Gauss_convolution(P_I1,I2)))

  ImageFloat Pg;
  gauss(Pg, P, 1.0f);

  double entropy=0;
  float *pg=Pg.getPtr(0, 0);

  for (long k=0; k<Pg.getHeight(); k++)
  {
    for (long i=0; i<Pg.getWidth(); i++)
    {
      entropy+=negLog(*pg);
      pg++;
    }
  }

  gauss(mi, Pg, 1.0f);

  // sum over columns for getting probabilities of image1

  ImageFloat P1(P.getWidth(), 1, 1);

  for (long i=0; i<P.getWidth(); i++)
  {
    float sum=0;
    for (long k=0; k<P.getHeight(); k++) sum+=P(i, k);
    P1(i, 0)=sum;
  }

  // compute entropy for image1

  GaussKernel gk(1.0f);

  ImageFloat Pg1(P.getWidth(), 1, 1);
  for (long i=0; i<P1.getWidth(); i++) Pg1(i, 0)=gk.convolveHorizontal(P1, i, 0, 0);

  double entropy1=0;
  pg=Pg1.getPtr(0, 0);

  for (long i=0; i<Pg1.getWidth(); i++)
  {
    entropy1+=negLog(*pg);
    pg++;
  }

  // convolve with Gauss again add to negative mi values

  for (long i=0; i<Pg1.getWidth(); i++)
  {
    float v=gk.convolveHorizontal(Pg1, i, 0, 0);
    for (long k=0; k<P.getHeight(); k++) mi(i, k)=v-mi(i, k);
  }

  // sum over rows for getting probabilities of image1

  P1.setSize(P.getHeight(), 1, 1);

  for (long k=0; k<P.getHeight(); k++)
  {
    float sum=0;
    for (long i=0; i<P.getWidth(); i++) sum+=P(i, k);
    P1(k, 0)=sum;
  }

  // compute entropy for image2

  Pg1.setSize(P.getHeight(), 1, 1);
  for (long i=0; i<Pg1.getWidth(); i++) Pg1(i, 0)=gk.convolveHorizontal(P1, i, 0, 0);

  double entropy2=0;
  pg=Pg1.getPtr(0, 0);

  for (long i=0; i<Pg1.getWidth(); i++)
  {
    entropy2+=negLog(*pg);
    pg++;
  }

  // convolve with Gauss again add to mi values

  for (long k=0; k<Pg1.getWidth(); k++)
  {
    float v=gk.convolveHorizontal(Pg1, k, 0, 0);
    for (long i=0; i<P.getWidth(); i++) mi(i, k)+=v;
  }

  // apply 1/n

  mi*=scale;

  return static_cast<float>(entropy1+entropy2-entropy);
}